

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_lazy_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint8_t uVar4;
  roaring_array_t *prVar5;
  ushort uVar6;
  uint uVar7;
  roaring_array_t *ra;
  container_t *pcVar8;
  int *c;
  int *piVar9;
  roaring_bitmap_t *prVar10;
  uint end_index;
  uint8_t uVar11;
  ulong uVar12;
  roaring_array_t *prVar13;
  uint16_t uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_85;
  uint8_t local_84;
  uint8_t local_83;
  uint16_t local_82;
  roaring_array_t *local_80;
  ulong local_78;
  roaring_array_t *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_83 = '\0';
  uVar16 = (x1->high_low_container).size;
  prVar10 = x2;
  local_80 = &x1->high_low_container;
  if (uVar16 != 0) {
    uVar7 = (x2->high_low_container).size;
    local_68 = (ulong)uVar7;
    prVar10 = x1;
    if (uVar7 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar7 + uVar16)->high_low_container;
      if (((local_80->flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)) {
        ra->flags = ra->flags & 0xfe;
      }
      else {
        ra->flags = ra->flags | 1;
      }
      uVar14 = *local_80->keys;
      local_82 = *(x2->high_low_container).keys;
      local_58 = (ulong)-uVar16;
      local_60 = 0;
      uVar15 = 0;
      local_70 = &x2->high_low_container;
      local_50 = (ulong)uVar16;
LAB_0011beb5:
      do {
        local_78 = uVar15 & 0xffffffff;
        iVar19 = (int)local_58 + (int)uVar15;
        local_38 = (long)(int)uVar15;
        local_40 = local_38 * 8;
        lVar18 = 0;
        local_48 = uVar15;
        while( true ) {
          prVar5 = local_70;
          prVar13 = local_80;
          uVar6 = (short)local_78 + (short)lVar18;
          iVar17 = (int)lVar18;
          uVar16 = (uint)local_60;
          if (uVar14 == local_82) break;
          if (local_82 <= uVar14) {
            local_85 = local_70->typecodes[local_60 & 0xffff];
            pcVar8 = get_copy_of_container
                               (local_70->containers[local_60 & 0xffff],&local_85,
                                (_Bool)(local_70->flags & 1));
            uVar11 = local_85;
            if ((prVar5->flags & 1) != 0) {
              local_70->containers[(int)uVar16] = pcVar8;
              local_70->typecodes[(int)uVar16] = local_85;
            }
            extend_array(ra,1);
            iVar19 = ra->size;
            ra->keys[iVar19] = local_82;
            ra->containers[iVar19] = pcVar8;
            ra->typecodes[iVar19] = uVar11;
            ra->size = ra->size + 1;
            uVar16 = uVar16 + 1;
            if (uVar16 != (uint)local_68) {
              local_82 = local_70->keys[(ulong)uVar16 & 0xffff];
            }
            if (uVar16 == (uint)local_68) {
              uVar7 = iVar17 + (int)local_78;
              goto LAB_0011c246;
            }
            uVar15 = (ulong)(uint)((int)local_78 + iVar17);
            local_60 = (ulong)uVar16;
            goto LAB_0011beb5;
          }
          local_84 = local_80->typecodes[uVar6];
          pcVar8 = get_copy_of_container
                             (local_80->containers[uVar6],&local_84,(_Bool)(local_80->flags & 1));
          uVar11 = local_84;
          if ((prVar13->flags & 1) != 0) {
            *(container_t **)((long)local_80->containers + lVar18 * 8 + local_40) = pcVar8;
            local_80->typecodes[lVar18 + local_38] = local_84;
          }
          extend_array(ra,1);
          iVar2 = ra->size;
          ra->keys[iVar2] = uVar14;
          ra->containers[iVar2] = pcVar8;
          ra->typecodes[iVar2] = uVar11;
          ra->size = ra->size + 1;
          if (iVar19 + iVar17 != -1) {
            uVar14 = local_80->keys[(ushort)((short)local_78 + (short)lVar18 + 1)];
          }
          lVar18 = lVar18 + 1;
          if ((int)lVar18 + iVar19 == 0) {
            uVar7 = (int)local_48 + (int)lVar18;
            uVar16 = (uint)local_60;
            goto LAB_0011c246;
          }
        }
        uVar7 = (int)local_78 + iVar17 & 0xffff;
        local_84 = local_80->typecodes[uVar7];
        local_85 = local_70->typecodes[uVar16 & 0xffff];
        c = (int *)container_lazy_xor(local_80->containers[uVar7],local_84,
                                      local_70->containers[uVar16 & 0xffff],local_85,&local_83);
        uVar4 = local_83;
        piVar9 = c;
        uVar11 = local_83;
        if (local_83 == '\x04') {
          uVar11 = (uint8_t)c[2];
          piVar9 = *(int **)c;
        }
        iVar19 = *piVar9;
        if ((uVar11 == '\x03') || (uVar11 == '\x02')) {
          bVar20 = 0 < iVar19;
        }
        else {
          if (iVar19 == -1) {
            if (**(long **)(piVar9 + 2) == 0) {
              uVar15 = 0xffffffffffffffff;
              do {
                if (uVar15 == 0x3fe) {
                  uVar12 = 0x3ff;
                  break;
                }
                uVar12 = uVar15 + 1;
                lVar3 = uVar15 + 2;
                uVar15 = uVar12;
              } while ((*(long **)(piVar9 + 2))[lVar3] == 0);
              bVar20 = 0x3fe < uVar12;
            }
            else {
              bVar20 = false;
            }
          }
          else {
            bVar20 = iVar19 == 0;
          }
          bVar20 = (bool)(bVar20 ^ 1);
        }
        if (bVar20) {
          extend_array(ra,1);
          iVar19 = ra->size;
          ra->keys[iVar19] = uVar14;
          ra->containers[iVar19] = c;
          ra->typecodes[iVar19] = uVar4;
          ra->size = ra->size + 1;
        }
        else {
          container_free(c,local_83);
        }
        uVar15 = local_78 + lVar18 + 1;
        uVar16 = uVar16 + 1;
        if (uVar16 == (uint)local_68 || (int)local_58 + (int)local_78 + iVar17 == -1) {
          uVar7 = iVar17 + (int)local_78 + 1;
LAB_0011c246:
          if (uVar7 == (uint)local_50) {
            bVar1 = local_70->flags;
            prVar13 = local_70;
            end_index = (uint)local_68;
            uVar7 = uVar16;
          }
          else {
            if (uVar16 != (uint)local_68) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = local_80->flags;
            prVar13 = local_80;
            end_index = (uint)local_50;
          }
          ra_append_copy_range(ra,prVar13,uVar7,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar14 = local_80->keys[(uint)uVar15 & 0xffff];
        local_82 = local_70->keys[uVar16 & 0xffff];
        local_60 = (ulong)uVar16;
      } while( true );
    }
  }
  prVar10 = roaring_bitmap_copy(prVar10);
  return prVar10;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_xor(const roaring_bitmap_t *x1,
                                          const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_lazy_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}